

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::add(Matrix *this,Matrix *input)

{
  ulong local_28;
  size_t i;
  Matrix *input_local;
  Matrix *this_local;
  
  if ((input->rows == this->rows) && (input->cols == this->cols)) {
    for (local_28 = 0; this_local = this, local_28 < this->rows * this->cols;
        local_28 = local_28 + 1) {
      this->data[local_28] = input->data[local_28] + this->data[local_28];
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"Rows and Cols don\'t match up");
    this_local = (Matrix *)0x0;
  }
  return this_local;
}

Assistant:

Matrix* Matrix::add(Matrix* input) {
	if (input->rows != rows || input->cols != cols) {
		std::cout << "Rows and Cols don't match up";
		return nullptr;
	}

	for (size_t i = 0; i < rows*cols; i++) {
		data[i] += input->data[i];
	}
	return this;
}